

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O2

bool __thiscall Timidity::GF1Envelope::Recompute(GF1Envelope *this,Voice *v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = this->volume;
  uVar4 = (ulong)(this->super_MinEnvelope).stage;
  while( true ) {
    uVar5 = uVar4;
    if (5 < uVar5) {
      this->increment = 0;
      (this->super_MinEnvelope).bUpdating = '\0';
      v->status = v->status & 0xe9 | 4;
      return false;
    }
    if (((uVar5 == 3) && ((v->status & 4) == 0)) && ((v->sample->modes & 0x20) != 0)) break;
    (this->super_MinEnvelope).stage = (BYTE)(uVar5 + 1);
    iVar2 = this->offset[uVar5];
    uVar4 = uVar5 + 1;
    if (iVar1 != iVar2) {
      this->target = iVar2;
      iVar3 = this->rate[uVar5];
      this->increment = iVar3;
      if (iVar2 < iVar1) {
        this->increment = -iVar3;
      }
      return false;
    }
  }
  v->status = v->status | 2;
  this->increment = 0;
  (this->super_MinEnvelope).bUpdating = '\0';
  return false;
}

Assistant:

bool GF1Envelope::Recompute(Voice *v)
{
	int newstage;

	newstage = stage;

	if (newstage > GF1_RELEASEC)
	{
		/* Envelope ran out. */
		increment = 0;
		bUpdating = false;
		v->status &= ~(VOICE_SUSTAINING | VOICE_LPE);
		v->status |= VOICE_RELEASING;
		/* play sampled release */
		return 0;
	}

	if (newstage == GF1_RELEASE && !(v->status & VOICE_RELEASING) && (v->sample->modes & PATCH_SUSTAIN))
	{
		v->status |= VOICE_SUSTAINING;
		/* Freeze envelope until note turns off. Trumpets want this. */
		increment = 0;
		bUpdating = false;
	}
	else
	{
		stage = newstage + 1;

		if (volume == offset[newstage])
		{
			return Recompute(v);
		}
		target = offset[newstage];
		increment = rate[newstage];
		if (target < volume)
			increment = -increment;
	}

	return 0;
}